

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  byte bVar2;
  uint32_t uVar3;
  uint3 uVar4;
  bool bVar5;
  uint8_t *puVar6;
  ChunkID CVar7;
  int *ptr;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  VP8StatusCode VVar12;
  WebPInfoStatus WVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  uint32_t *puVar22;
  size_t sVar23;
  ulong uVar24;
  WebPInfoStatus WVar25;
  WebPInfo webp_info;
  size_t size;
  uint8_t *data;
  undefined8 local_158;
  undefined8 uStack_150;
  uint local_148 [8];
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  char **local_d8;
  uint local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  ChunkData local_b8;
  uint3 *local_98;
  ulong local_90;
  undefined8 local_88;
  uint local_80;
  uint local_7c;
  undefined8 local_78;
  uint local_70;
  uint local_6c;
  int local_68;
  ulong local_38;
  
  if (argc != 1) {
    local_cc = argc;
    if (argc < 2) {
      local_bc = 0;
      uVar24 = 1;
      local_c4 = 0;
      local_c8 = 0;
      local_c0 = 0;
    }
    else {
      local_c0 = 0;
      uVar24 = 1;
      local_c8 = 0;
      local_c4 = 0;
      local_bc = 0;
      do {
        pcVar20 = argv[uVar24];
        iVar9 = strcmp(pcVar20,"-h");
        if ((((iVar9 == 0) || (iVar9 = strcmp(pcVar20,"-help"), iVar9 == 0)) ||
            (iVar9 = strcmp(pcVar20,"-H"), iVar9 == 0)) ||
           (iVar9 = strcmp(pcVar20,"-longhelp"), iVar9 == 0)) {
          puts(
              "Usage: webpinfo [options] in_files\nNote: there could be multiple input files;\n      options must come before input files.\nOptions:\n  -version ........... Print version number and exit.\n  -quiet ............. Do not show chunk parsing information.\n  -diag .............. Show parsing error diagnosis.\n  -summary ........... Show chunk stats summary.\n  -bitstream_info .... Parse bitstream header."
              );
          return 0;
        }
        iVar9 = strcmp(pcVar20,"-quiet");
        if (iVar9 == 0) {
          local_bc = 1;
        }
        else {
          iVar9 = strcmp(pcVar20,"-diag");
          if (iVar9 == 0) {
            local_c4 = 1;
          }
          else {
            iVar9 = strcmp(pcVar20,"-summary");
            if (iVar9 == 0) {
              local_c8 = 1;
            }
            else {
              iVar9 = strcmp(pcVar20,"-bitstream_info");
              if (iVar9 != 0) {
                iVar9 = strcmp(pcVar20,"-version");
                if (iVar9 == 0) {
                  uVar17 = WebPGetDecoderVersion();
                  printf("WebP Decoder version: %d.%d.%d\n",(ulong)(uVar17 >> 0x10 & 0xff),
                         (ulong)(uVar17 >> 8 & 0xff),(ulong)(uVar17 & 0xff));
                  return 0;
                }
                goto LAB_00102f28;
              }
              local_c0 = 1;
            }
          }
        }
        uVar24 = uVar24 + 1;
      } while ((uint)argc != uVar24);
      uVar24 = (ulong)local_cc;
    }
LAB_00102f28:
    if ((uint)uVar24 != local_cc) {
      if ((int)local_cc <= (int)(uint)uVar24) {
        return 0;
      }
      uVar24 = uVar24 & 0xffffffff;
      uVar17 = local_cc;
      local_d8 = argv;
      do {
        local_f8 = 0;
        iStack_f4 = 0;
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110._0_4_ = 0;
        uStack_110._4_4_ = 0;
        local_128 = 0;
        uStack_120 = 0;
        local_148[4] = 0;
        local_148[5] = 0;
        local_148[6] = 0;
        local_148[7] = 0;
        local_148[0] = 0;
        local_148[1] = 0;
        local_148[2] = 0;
        local_148[3] = 0;
        local_158 = (int *)0x0;
        uStack_150 = 0;
        iStack_f0 = 0;
        iVar9 = iStack_f0;
        iStack_f0 = 0;
        iStack_ec = local_bc;
        iStack_e4 = local_c8;
        local_e8 = local_c4;
        iStack_e0 = 0;
        iVar8 = iStack_e0;
        iStack_e0 = 0;
        iStack_dc = local_c0;
        pcVar20 = argv[uVar24];
        if ((pcVar20 == (char *)0x0) ||
           (iVar10 = ImgIoUtilReadFile(pcVar20,(uint8_t **)&local_78,&local_b8.offset_),
           ptr = local_78, sVar23 = local_b8.offset_, iVar9 = iStack_f0, iVar8 = iStack_e0,
           iVar10 == 0)) {
          iStack_e0 = iVar8;
          iStack_f0 = iVar9;
          fprintf(_stderr,"Failed to open input file %s.\n",pcVar20);
          uVar11 = 1;
        }
        else {
          if (iStack_ec == 0) {
            printf("File: %s\n",pcVar20);
          }
          local_38 = uVar24;
          if (sVar23 < 0x14) {
            WVar13 = WEBP_INFO_TRUNCATED_DATA;
            if (local_e8 != 0) {
              main_cold_6();
            }
LAB_00103081:
            uVar14 = 0;
            bVar5 = false;
          }
          else {
            if ((*ptr != 0x46464952) || (ptr[2] != 0x50424557)) {
              WVar13 = WEBP_INFO_PARSE_ERROR;
              if (local_e8 != 0) {
                main_cold_1();
              }
              goto LAB_00103081;
            }
            uVar17 = ptr[1];
            if ((ulong)uVar17 < 8) {
              WVar13 = WEBP_INFO_PARSE_ERROR;
              if (local_e8 != 0) {
                main_cold_5();
              }
              goto LAB_00103081;
            }
            if (0xfffffff6 < uVar17) {
              WVar13 = WEBP_INFO_PARSE_ERROR;
              if (local_e8 != 0) {
                main_cold_4();
              }
              goto LAB_00103081;
            }
            uVar24 = (ulong)uVar17 + 8;
            if (iStack_ec == 0) {
              puts("RIFF HEADER:");
              printf("  File size: %6d\n",uVar24 & 0xffffffff);
            }
            if (uVar24 < sVar23) {
              if (local_e8 != 0) {
                main_cold_3();
              }
              iStack_e0 = iStack_e0 + 1;
              WVar13 = WEBP_INFO_OK;
              bVar5 = true;
              uVar14 = 0xc;
              sVar23 = uVar24;
            }
            else {
              if (sVar23 < uVar24) {
                WVar13 = WEBP_INFO_TRUNCATED_DATA;
                if (local_e8 != 0) {
                  main_cold_2();
                }
                goto LAB_00103081;
              }
              WVar13 = WEBP_INFO_OK;
              bVar5 = true;
              uVar14 = 0xc;
            }
          }
          if (bVar5) {
            do {
              if (sVar23 == uVar14) {
                WVar13 = 0x129ff0;
                if (iStack_e4 != 0) {
                  puts("Summary:");
                  printf("Number of frames: %d\n",uStack_150 >> 0x20);
                  puts("Chunk type  :  VP8 VP8L VP8X ALPH ANIM ANMF(VP8 /VP8L/ALPH) ICCP EXIF  XMP")
                  ;
                  printf("Chunk counts: ");
                  lVar18 = 0;
                  do {
                    printf("%4d ",(ulong)local_148[lVar18]);
                    if (lVar18 == 5) {
                      printf("%4d %4d %4d  ",local_128 >> 0x20,uStack_120 & 0xffffffff,
                             uStack_120 >> 0x20);
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 9);
                  putchar(10);
                }
                uVar24 = local_118;
                if (uStack_150._4_4_ < 1) {
                  WVar13 = WEBP_INFO_MISSING_DATA;
                  if (local_e8 != 0) {
                    main_cold_48();
                  }
                }
                else {
                  if (local_148[2] != 0) {
                    if ((local_118 & 0x1000000000) == 0) {
                      if ((uint)uStack_110 == 0) goto LAB_00103fad;
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 == 0) goto LAB_0010416c;
                      pcVar20 = "Unexpected alpha data detected.";
LAB_00104132:
                      bVar5 = false;
                      fprintf(_stderr,"Error: %s\n",pcVar20);
                    }
                    else {
                      if ((uint)uStack_110 == 0) {
                        if (local_e8 != 0) {
                          main_cold_47();
                        }
                        iStack_e0 = iStack_e0 + 1;
                      }
LAB_00103fad:
                      if (((uVar24 & 0x2000000000) != 0) && (local_148[6] == 0)) {
                        WVar13 = WEBP_INFO_MISSING_DATA;
                        if (local_e8 == 0) goto LAB_0010416c;
                        pcVar20 = "Missing ICCP chunk.";
                        goto LAB_00104132;
                      }
                      if (((uVar24 & 0x800000000) == 0) || (local_148[7] != 0)) {
                        if (((uVar24 & 0x400000000) != 0) && ((int)local_128 == 0)) {
                          WVar13 = WEBP_INFO_MISSING_DATA;
                          if (local_e8 != 0) {
                            pcVar20 = "Missing XMP chunk.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                        if (((uVar24 & 0x2000000000) == 0) && (local_148[6] != 0)) {
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            pcVar20 = "Unexpected ICCP chunk detected.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                        if (((uVar24 & 0x800000000) == 0) && (local_148[7] != 0)) {
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            pcVar20 = "Unexpected EXIF chunk detected.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                        if (((uVar24 & 0x400000000) == 0) && ((int)local_128 != 0)) {
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            pcVar20 = "Unexpected XMP chunk detected.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                        if (local_f8 != 0) {
                          WVar13 = WEBP_INFO_MISSING_DATA;
                          goto LAB_0010416c;
                        }
                        if ((uVar24 & 0x200000000) != 0) {
                          if (local_148[4] != 0) {
                            bVar5 = true;
                            if (local_148[5] != 0) goto LAB_0010416e;
                          }
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            pcVar20 = "No ANIM/ANMF chunk detected in animation file.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                        bVar5 = true;
                        if (1 < uStack_150._4_4_) {
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            pcVar20 = "More than 1 frame detected in non-animation file.";
                            goto LAB_00104132;
                          }
                          goto LAB_0010416c;
                        }
                      }
                      else {
                        WVar13 = WEBP_INFO_MISSING_DATA;
                        if (local_e8 != 0) {
                          pcVar20 = "Missing EXIF chunk.";
                          goto LAB_00104132;
                        }
LAB_0010416c:
                        bVar5 = false;
                      }
                    }
LAB_0010416e:
                    if (!bVar5) break;
                  }
                  WVar13 = WEBP_INFO_OK;
                }
                break;
              }
              local_b8.payload_ = (uint8_t *)0x0;
              local_b8._24_8_ = 0;
              local_b8.offset_ = 0;
              local_b8.size_ = 0;
              if (sVar23 - uVar14 < 8) {
                WVar13 = WEBP_INFO_TRUNCATED_DATA;
                if (local_e8 != 0) {
                  main_cold_10();
                }
                bVar5 = false;
                uVar24 = uVar14;
                goto LAB_00103144;
              }
              bVar2 = *(byte *)((long)ptr + uVar14 + 4);
              uVar17 = (uint)*(byte *)((long)ptr + uVar14 + 6) << 0x10 |
                       (uint)*(byte *)((long)ptr + uVar14 + 5) << 8 |
                       (uint)*(byte *)((long)ptr + uVar14 + 7) << 0x18 | (uint)bVar2;
              uVar24 = uVar14 + 8;
              if (uVar17 < 0xfffffff7) {
                uVar11 = bVar2 & 1;
                uVar16 = (ulong)(uVar17 + uVar11);
                if (sVar23 - uVar24 < uVar16) {
                  WVar13 = WEBP_INFO_TRUNCATED_DATA;
                  if (local_e8 != 0) {
                    main_cold_8();
                  }
                  goto LAB_0010313f;
                }
                puVar22 = kWebPChunkTags;
                uVar19 = 0;
                do {
                  if (*puVar22 == *(uint32_t *)((long)ptr + uVar14)) goto LAB_00103287;
                  uVar19 = uVar19 + 1;
                  puVar22 = puVar22 + 1;
                } while (uVar19 != 9);
                uVar19 = 9;
LAB_00103287:
                local_b8.offset_ = uVar14;
                local_b8.size_ = (ulong)(uVar17 + uVar11 + 8);
                local_b8._24_8_ = uVar19 & 0xffffffff;
                local_b8.payload_ = (uint8_t *)(uVar24 + (long)ptr);
                if ((int)uVar19 == 5) {
                  if ((bVar2 & 1) != 0) {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_7();
                    }
                    goto LAB_0010313f;
                  }
                  uVar24 = uVar14 + 0x18;
                  WVar13 = WEBP_INFO_OK;
                  bVar5 = true;
                }
                else {
                  uVar24 = uVar24 + uVar16;
                  WVar13 = WEBP_INFO_OK;
                  bVar5 = true;
                }
              }
              else {
                WVar13 = WEBP_INFO_INVALID_PARAM;
                if (local_e8 != 0) {
                  main_cold_9();
                }
LAB_0010313f:
                bVar5 = false;
              }
LAB_00103144:
              if (!bVar5) break;
              CVar7 = local_b8.id_;
              uVar14 = local_b8._24_8_ & 0xffffffff;
              if (uVar14 == 9) {
                snprintf((char *)&local_78,0x32,"Unknown chunk at offset %6d, length %6d",
                         local_b8.offset_ & 0xffffffff,local_b8.size_ & 0xffffffff);
                if (local_e8 != 0) {
                  fprintf(_stderr,"Warning: %s\n",&local_78);
                }
                iStack_e0 = iStack_e0 + 1;
              }
              else if (iStack_ec == 0) {
                uVar3 = kWebPChunkTags[uVar14];
                printf("Chunk %c%c%c%c at offset %6d, length %6d\n",(ulong)(uint)(int)(char)uVar3,
                       (ulong)(uint)(int)(char)(uVar3 >> 8),(ulong)(uint)(int)(char)(uVar3 >> 0x10),
                       (ulong)(uint)((int)uVar3 >> 0x18),local_b8.offset_ & 0xffffffff,
                       (undefined4)local_b8.size_);
              }
              puVar6 = local_b8.payload_;
              WVar13 = WEBP_INFO_OK;
              WVar25 = WEBP_INFO_OK;
              switch(uVar14) {
              case 0:
              case 1:
                VVar12 = WebPGetFeaturesInternal
                                   ((uint8_t *)((long)local_b8.payload_ + -8),local_b8.size_,
                                    (WebPBitstreamFeatures *)&local_78,0x209);
                if (VVar12 == VP8_STATUS_OK) {
                  if (iStack_ec == 0) {
                    printf("  Width: %d\n  Height: %d\n  Alpha: %d\n  Animation: %d\n  Format: %s (%d)\n"
                           ,(ulong)local_78 & 0xffffffff,(ulong)local_78 >> 0x20,(ulong)local_70,
                           (ulong)local_6c,
                           (long)&kFormats_rel + (long)(int)(&kFormats_rel)[local_68],local_68);
                  }
                  if (local_f8 == 0) {
                    if (local_148[1] == 0 && local_148[0] == 0) {
                      if ((CVar7 == CHUNK_VP8L) && (local_148[3] != 0)) {
                        if (local_e8 != 0) {
                          main_cold_41();
                        }
                        iStack_e0 = iStack_e0 + 1;
                      }
                      if (local_148[5] == 0 && local_148[4] == 0) {
                        if (local_148[2] == 0) {
                          local_158 = local_78;
                          if ((((int)local_78 + 0xfeffffffU < 0xff000000) ||
                              (local_78._4_4_ + 0xfeffffff < 0xff000000)) ||
                             (0x100000000 < (ulong)local_78._4_4_ * ((ulong)local_78 & 0xffffffff)))
                          {
                            if (local_e8 != 0) {
                              main_cold_44();
                            }
                            iStack_e0 = iStack_e0 + 1;
                          }
                        }
                        else if (((uint)local_158 != (int)local_78) ||
                                (local_158._4_4_ != local_78._4_4_)) {
                          WVar13 = WEBP_INFO_PARSE_ERROR;
                          if (local_e8 != 0) {
                            main_cold_43();
                          }
                          break;
                        }
                        local_148[uVar14] = local_148[uVar14] + 1;
LAB_00103b32:
                        uStack_150 = CONCAT44(uStack_150._4_4_ + 1,(int)uStack_150);
                        uStack_110._0_4_ = (uint)uStack_110 | local_70;
                        if (iStack_dc != 0) {
                          if (uVar14 == 0) {
                            WVar13 = ParseLossyHeader(&local_b8,(WebPInfo *)&local_158);
                          }
                          else {
                            WVar13 = ParseLosslessHeader(&local_b8,(WebPInfo *)&local_158);
                          }
                          goto LAB_00103d54;
                        }
                        goto LAB_00103d59;
                      }
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_42();
                      }
                    }
                    else {
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_40();
                      }
                    }
                  }
                  else {
                    piVar1 = (int *)((long)&local_128 + (ulong)(uVar14 != 0) * 4 + 4);
                    *piVar1 = *piVar1 + 1;
                    if ((CVar7 == CHUNK_VP8L) && (iStack_f4 != 0)) {
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_37();
                      }
                    }
                    else {
                      if (uStack_110._4_4_ == (int)local_78) {
                        if ((int)local_108 == local_78._4_4_) {
                          if (iStack_f0 != 0) {
                            WVar13 = WEBP_INFO_PARSE_ERROR;
                            if (local_e8 != 0) {
                              main_cold_39();
                            }
                            break;
                          }
                          iStack_f0 = 1;
                          goto LAB_00103b32;
                        }
                      }
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_38();
                      }
                    }
                  }
                }
                else {
                  WVar13 = WEBP_INFO_BITSTREAM_ERROR;
                  if (local_e8 != 0) {
                    main_cold_36();
                  }
                }
                break;
              case 2:
                if (((local_148[0] == 0) && (local_148[1] == 0)) && (local_148[2] == 0)) {
                  if (local_b8.size_ == 0x12) {
                    local_148[2] = 1;
                    bVar2 = *local_b8.payload_;
                    local_118 = (ulong)CONCAT14(bVar2,(uint32_t)local_118);
                    local_158 = (int *)CONCAT44((uint)*(byte *)((long)local_b8.payload_ + 9) *
                                                0x10000 + (uint)*(ushort *)
                                                                 ((long)local_b8.payload_ + 7) + 1,
                                                (uint)(ushort)*(uint3 *)((long)local_b8.payload_ + 4
                                                                        ) +
                                                (uint)*(byte *)((long)local_b8.payload_ + 6) *
                                                0x10000 + 1);
                    if (iStack_ec == 0) {
                      printf("  ICCP: %d\n  Alpha: %d\n  EXIF: %d\n  XMP: %d\n  Animation: %d\n",
                             (ulong)(bVar2 >> 5 & 1),(ulong)(bVar2 >> 4 & 1),(ulong)(bVar2 >> 3 & 1)
                             ,(ulong)(bVar2 >> 2 & 1),(ulong)(bVar2 >> 1 & 1));
                      printf("  Canvas size %d x %d\n",(ulong)local_158 & 0xffffffff,
                             (ulong)local_158 >> 0x20);
                    }
                    if (0x1000000 < (int)(uint)local_158) {
                      if (local_e8 != 0) {
                        main_cold_33();
                      }
                      iStack_e0 = iStack_e0 + 1;
                    }
                    if (0x1000000 < (int)local_158._4_4_) {
                      if (local_e8 != 0) {
                        main_cold_34();
                      }
                      iStack_e0 = iStack_e0 + 1;
                    }
                    WVar13 = WVar25;
                    if (0x100000000 <
                        (ulong)((long)(int)local_158._4_4_ * (long)(int)(uint)local_158)) {
                      if (local_e8 != 0) {
                        main_cold_35();
                      }
                      iStack_e0 = iStack_e0 + 1;
LAB_00103d59:
                      WVar13 = WEBP_INFO_OK;
                    }
                  }
                  else {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_32();
                    }
                  }
                }
                else {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_31();
                  }
                }
                break;
              case 3:
                if (local_f8 == 0) {
                  if (local_148[5] == 0 && local_148[4] == 0) {
                    if (local_148[2] == 0) {
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_30();
                      }
                    }
                    else if (local_148[0] == 0) {
                      if (local_148[3] == 0) {
                        local_148[3] = 1;
                        goto LAB_00103b77;
                      }
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_25();
                      }
                    }
                    else {
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_24();
                      }
                    }
                  }
                  else {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_23();
                    }
                  }
                }
                else {
                  uStack_120 = CONCAT44(uStack_120._4_4_ + 1,(int)uStack_120);
                  if (iStack_f4 == 0) {
                    iStack_f4 = 1;
                    if (iStack_f0 == 0) {
LAB_00103b77:
                      uStack_110._0_4_ = 1;
                      if (iStack_dc == 0) goto LAB_00103d59;
                      if ((local_b8.size_ & 0xfffffffffffffffe) == 8) {
                        WVar13 = WEBP_INFO_TRUNCATED_DATA;
                        if (local_e8 != 0) {
                          main_cold_29();
                        }
                      }
                      else {
                        local_90 = local_b8.size_;
                        puts("  Parsing ALPH chunk...");
                        local_98 = (uint3 *)puVar6;
                        bVar2 = *puVar6;
                        local_88 = CONCAT44(local_88._4_4_,(uint)bVar2) & 0xffffffff00000003;
                        uVar14 = (ulong)(bVar2 >> 2 & 3);
                        uVar11 = bVar2 >> 4 & 3;
                        printf("  Compression:      %d\n",(ulong)(bVar2 & 3));
                        printf("  Filter:           %s (%d)\n",
                               kAlphaFilterMethods_rel +
                               *(int *)(kAlphaFilterMethods_rel + uVar14 * 4),uVar14);
                        printf("  Pre-processing:   %d\n",(ulong)uVar11);
                        argv = local_d8;
                        uVar17 = (uint)local_88;
                        if ((uint)local_88 < 2) {
                          if (uVar11 < 2) {
                            if (0x3f < bVar2) {
                              if (local_e8 != 0) {
                                main_cold_26();
                              }
                              iStack_e0 = iStack_e0 + 1;
                            }
                            WVar13 = WEBP_INFO_OK;
                            if (uVar17 == 1) {
                              local_78 = (int *)0x0;
                              WVar13 = ParseLosslessTransform
                                                 ((WebPInfo *)&local_158,
                                                  (byte *)((long)local_98 + 1),local_90 - 9,
                                                  &local_78);
                            }
                          }
                          else {
                            WVar13 = WEBP_INFO_BITSTREAM_ERROR;
                            if (local_e8 != 0) {
                              main_cold_27();
                            }
                          }
                        }
                        else {
                          WVar13 = WEBP_INFO_BITSTREAM_ERROR;
                          if (local_e8 != 0) {
                            main_cold_28();
                            argv = local_d8;
                          }
                        }
                      }
LAB_00103d54:
                      if (WVar13 == WEBP_INFO_OK) goto LAB_00103d59;
                    }
                    else {
                      WVar13 = WEBP_INFO_PARSE_ERROR;
                      if (local_e8 != 0) {
                        main_cold_22();
                      }
                    }
                  }
                  else {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_21();
                    }
                  }
                }
                break;
              case 4:
                if (local_148[2] == 0) {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_20();
                  }
                }
                else if (local_b8.size_ == 0xe) {
                  local_118 = CONCAT44(local_118._4_4_,
                                       (uint)*(byte *)((long)local_b8.payload_ + 2) << 0x10 |
                                       (uint)*(byte *)((long)local_b8.payload_ + 1) << 8 |
                                       (uint)*(byte *)((long)local_b8.payload_ + 3) << 0x18 |
                                       (uint)*local_b8.payload_);
                  uStack_150 = CONCAT44(uStack_150._4_4_,
                                        (uint)(ushort)*(uint3 *)((long)local_b8.payload_ + 4));
                  local_148[4] = local_148[4] + 1;
                  if (iStack_ec == 0) {
                    printf("  Background color:(ARGB) %02x %02x %02x %02x\n");
                    printf("  Loop count      : %d\n",uStack_150 & 0xffffffff);
                  }
                  WVar13 = WVar25;
                  if (0x10000 < (int)uStack_150) {
                    if (local_e8 != 0) {
                      main_cold_19();
                    }
                    iStack_e0 = iStack_e0 + 1;
                  }
                }
                else {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_18();
                  }
                }
                break;
              case 5:
                if (local_f8 == 0) {
                  if (local_148[4] == 0) {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_17();
                    }
                  }
                  else {
                    local_88 = local_b8.size_;
                    if (local_b8.size_ < 0x19) {
                      WVar13 = WEBP_INFO_TRUNCATED_DATA;
                      if (local_e8 != 0) {
                        main_cold_16();
                      }
                    }
                    else {
                      local_90 = (ulong)(uint)*(uint3 *)local_b8.payload_;
                      uVar11 = (uint)*(uint3 *)local_b8.payload_ * 2;
                      uVar4 = *(uint3 *)((long)local_b8.payload_ + 3);
                      uVar15 = (uint)*(ushort *)((long)local_b8.payload_ + 6) +
                               (uint)(byte)*(uint3 *)((long)local_b8.payload_ + 8) * 0x10000 + 1;
                      local_148[5] = local_148[5] + 1;
                      uVar21 = (uint)*(ushort *)((long)local_b8.payload_ + 9) +
                               (uint)*(byte *)((long)local_b8.payload_ + 0xb) * 0x10000 + 1;
                      uVar17 = (uint)uVar4 * 2;
                      if (iStack_ec == 0) {
                        local_98 = (uint3 *)CONCAT44(local_98._4_4_,uVar11);
                        local_80 = uVar17;
                        local_7c = uVar21;
                        printf("  Offset_X: %d\n  Offset_Y: %d\n  Width: %d\n  Height: %d\n  Duration: %d\n  Dispose: %d\n  Blend: %d\n"
                               ,(ulong)uVar11,(ulong)uVar17,(ulong)uVar15,(ulong)uVar21,
                               (ulong)*(uint3 *)((long)local_b8.payload_ + 0xc),
                               *(byte *)((long)local_b8.payload_ + 0xf) & 1,
                               *(byte *)((long)local_b8.payload_ + 0xf) >> 1 & 1);
                        uVar11 = (uint)local_98;
                        uVar17 = local_80;
                        uVar21 = local_7c;
                      }
                      argv = local_d8;
                      if (((uint)local_90 < 0x800001) && (uVar4 < 0x800001)) {
                        if (((uint)local_158 < uVar11 + uVar15) ||
                           (local_158._4_4_ < uVar17 + uVar21)) {
                          WVar13 = WEBP_INFO_INVALID_PARAM;
                          if (local_e8 != 0) {
                            main_cold_14();
                          }
                        }
                        else {
                          local_f8 = 1;
                          iStack_f4 = 0;
                          iStack_f0 = 0;
                          uStack_110._4_4_ = uVar15;
                          local_108._0_4_ = uVar21;
                          uStack_100 = local_88 - 0x18;
                          WVar13 = WEBP_INFO_OK;
                        }
                      }
                      else {
                        WVar13 = WEBP_INFO_INVALID_PARAM;
                        if (local_e8 != 0) {
                          main_cold_15();
                          argv = local_d8;
                        }
                      }
                    }
                  }
                }
                else {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_13();
                  }
                }
                break;
              case 6:
                if (local_148[2] == 0) {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_12();
                  }
                }
                else if (((local_148[0] == 0) && (local_148[1] == 0)) && (local_148[4] == 0)) {
                  local_148[6] = local_148[6] + 1;
                }
                else {
                  WVar13 = WEBP_INFO_PARSE_ERROR;
                  if (local_e8 != 0) {
                    main_cold_11();
                  }
                }
                break;
              case 7:
              case 8:
                local_148[uVar14] = local_148[uVar14] + 1;
              }
              if ((CVar7 != CHUNK_ANMF) && (local_f8 != 0)) {
                uVar14 = uStack_100 - local_b8.size_;
                if (uVar14 == 0) {
                  if (iStack_f0 == 0) {
                    WVar13 = WEBP_INFO_PARSE_ERROR;
                    if (local_e8 != 0) {
                      main_cold_46();
                    }
                  }
                  else {
                    local_f8 = 0;
                  }
                }
                else if (uStack_100 < local_b8.size_ || uVar14 == 0) {
                  WVar13 = WEBP_INFO_TRUNCATED_DATA;
                  if (local_e8 != 0) {
                    main_cold_45();
                  }
                }
                else {
                  uStack_100 = uVar14;
                }
              }
              uVar14 = uVar24;
            } while (WVar13 == WEBP_INFO_OK);
          }
          if (iStack_ec == 0) {
            pcVar20 = "Errors detected.";
            if (WVar13 == WEBP_INFO_OK) {
              pcVar20 = "No error detected.";
            }
            puts(pcVar20);
            if (0 < iStack_e0) {
              printf("There were %d warning(s).\n");
            }
          }
          WebPFree(ptr);
          uVar11 = (uint)(WVar13 != WEBP_INFO_OK);
          uVar24 = local_38;
          uVar17 = local_cc;
        }
        uVar24 = uVar24 + 1;
        if ((int)uVar17 <= (int)uVar24) {
          return uVar11;
        }
      } while( true );
    }
  }
  puts(
      "Usage: webpinfo [options] in_files\nNote: there could be multiple input files;\n      options must come before input files.\nOptions:\n  -version ........... Print version number and exit.\n  -quiet ............. Do not show chunk parsing information.\n  -diag .............. Show parsing error diagnosis.\n  -summary ........... Show chunk stats summary.\n  -bitstream_info .... Parse bitstream header."
      );
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  int c, quiet = 0, show_diag = 0, show_summary = 0;
  int parse_bitstream = 0;
  WebPInfoStatus webp_info_status = WEBP_INFO_OK;
  WebPInfo webp_info;

  INIT_WARGV(argc, argv);

  if (argc == 1) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Parse command-line input.
  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help") ||
        !strcmp(argv[c], "-H") || !strcmp(argv[c], "-longhelp")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-diag")) {
      show_diag = 1;
    } else if (!strcmp(argv[c], "-summary")) {
      show_summary = 1;
    } else if (!strcmp(argv[c], "-bitstream_info")) {
      parse_bitstream = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("WebP Decoder version: %d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else {  // Assume the remaining are all input files.
      break;
    }
  }

  if (c == argc) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Process input files one by one.
  for (; c < argc; ++c) {
    WebPData webp_data;
    const W_CHAR* in_file = NULL;
    WebPInfoInit(&webp_info);
    webp_info.quiet_ = quiet;
    webp_info.show_diagnosis_ = show_diag;
    webp_info.show_summary_ = show_summary;
    webp_info.parse_bitstream_ = parse_bitstream;
    in_file = GET_WARGV(argv, c);
    if (in_file == NULL ||
        !ReadFileToWebPData((const char*)in_file, &webp_data)) {
      webp_info_status = WEBP_INFO_INVALID_COMMAND;
      WFPRINTF(stderr, "Failed to open input file %s.\n", in_file);
      continue;
    }
    if (!webp_info.quiet_) WPRINTF("File: %s\n", in_file);
    webp_info_status = AnalyzeWebP(&webp_info, &webp_data);
    WebPDataClear(&webp_data);
  }
  FREE_WARGV_AND_RETURN((webp_info_status == WEBP_INFO_OK) ? EXIT_SUCCESS
                                                           : EXIT_FAILURE);
}